

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86_fma::destroy_pipeline(DeformableConv2D_x86_fma *this,Option *opt)

{
  Layer *pLVar1;
  
  pLVar1 = this->inner_product;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->inner_product != (Layer *)0x0) {
      (*this->inner_product->_vptr_Layer[1])();
    }
    this->inner_product = (Layer *)0x0;
  }
  pLVar1 = this->permute;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->permute != (Layer *)0x0) {
      (*this->permute->_vptr_Layer[1])();
    }
    this->permute = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_fma::destroy_pipeline(const Option& opt)
{
    if (inner_product)
    {
        inner_product->destroy_pipeline(opt);
        delete inner_product;
        inner_product = 0;
    }
    if (permute)
    {
        permute->destroy_pipeline(opt);
        delete permute;
        permute = 0;
    }

    return 0;
}